

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::CheckBufferPermissions
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
           *this,TEmitBufferAllocation *allocation)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SIZE_T SVar4;
  char *lpAddress;
  size_t sVar5;
  undefined1 local_60 [8];
  MEMORY_BASIC_INFORMATION memInfo;
  
  sVar5 = allocation->bytesCommitted;
  if (sVar5 != 0) {
    lpAddress = allocation->allocation->address;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      SVar4 = VirtualQuery(lpAddress,(PMEMORY_BASIC_INFORMATION)local_60,0x30);
      if (SVar4 == 0) {
LAB_0040a230:
        bVar2 = false;
      }
      else {
        if (memInfo.RegionSize._4_4_ == 0x40) {
          Output::Print(L"ERROR: Found PAGE_EXECUTE_READWRITE page!\n");
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                             ,600,"(0)","Page was marked PAGE_EXECUTE_READWRITE");
          if (!bVar2) goto LAB_0040a249;
          *puVar3 = 0;
        }
        if (sVar5 <= (ulong)memInfo._16_8_) goto LAB_0040a230;
        lpAddress = lpAddress + memInfo._16_8_;
        bVar2 = true;
        sVar5 = sVar5 - memInfo._16_8_;
        if (sVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                             ,0x26b,"(0)","Last VirtualQuery left us with unmatched regions");
          if (!bVar2) {
LAB_0040a249:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
          sVar5 = 0;
          goto LAB_0040a230;
        }
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CheckBufferPermissions(TEmitBufferAllocation *allocation)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    if(allocation->bytesCommitted == 0)
        return;

    MEMORY_BASIC_INFORMATION memInfo;

    BYTE *buffer = (BYTE*) allocation->allocation->address;
    SIZE_T size = allocation->bytesCommitted;

    while(1)
    {
        SIZE_T result = VirtualQuery(buffer, &memInfo, sizeof(memInfo));
        if(result == 0)
        {
            // VirtualQuery failed.  This is not an expected condition, but it would be benign for the purposes of this check.  Seems
            // to occur occasionally on process shutdown.
            break;
        }
        else if(memInfo.Protect == PAGE_EXECUTE_READWRITE)
        {
            Output::Print(_u("ERROR: Found PAGE_EXECUTE_READWRITE page!\n"));
#ifdef DEBUG
            AssertMsg(FALSE, "Page was marked PAGE_EXECUTE_READWRITE");
#else
            Fatal();
#endif
        }

        // Figure out if we need to continue the query.  The returned size might be larger than the size we requested,
        // for instance if more pages were allocated directly afterward, with the same permissions.
        if(memInfo.RegionSize >= size)
        {
            break;
        }

        // recalculate size for next iteration
        buffer += memInfo.RegionSize;
        size -= memInfo.RegionSize;

        if(size <= 0)
        {
            AssertMsg(FALSE, "Last VirtualQuery left us with unmatched regions");
            break;
        }
    }
}